

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor *
ggml_flash_attn_ext(ggml_context *ctx,ggml_tensor *q,ggml_tensor *k,ggml_tensor *v,ggml_tensor *mask
                   ,float scale,float max_bias,float logit_softcap)

{
  long lVar1;
  long lVar2;
  _Bool _Var3;
  long lVar4;
  ggml_tensor *pgVar5;
  char *pcVar6;
  int line;
  char *file;
  int64_t ne [4];
  int64_t local_58;
  long local_50;
  long local_48;
  long local_40;
  
  if (((k->ne[0] != q->ne[0]) || (lVar1 = q->ne[2], lVar1 % k->ne[2] != 0)) ||
     (lVar2 = q->ne[3], lVar2 % k->ne[3] != 0)) {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
    pcVar6 = "ggml_can_mul_mat(k, q)";
    line = 0x1135;
    goto LAB_0011e374;
  }
  if (mask == (ggml_tensor *)0x0) {
    if (0.0 < max_bias) {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
      pcVar6 = "mask";
      line = 0x1142;
      goto LAB_0011e374;
    }
    lVar4 = q->ne[1];
  }
  else {
    _Var3 = ggml_is_contiguous_n(mask,0);
    if (!_Var3) {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
      pcVar6 = "ggml_is_contiguous(mask)";
      line = 0x1139;
      goto LAB_0011e374;
    }
    if (mask->ne[2] != 1) {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
      pcVar6 = "mask->ne[2] == 1";
      line = 0x113a;
      goto LAB_0011e374;
    }
    if (mask->ne[3] != 1) {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
      pcVar6 = "mask->ne[3] == 1";
      line = 0x113b;
      goto LAB_0011e374;
    }
    lVar4 = q->ne[1];
    if (mask->ne[1] < (long)(lVar4 + 0x3fU & 0xffffffffffffffc0)) {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
      pcVar6 = 
      "mask->ne[1] >= GGML_PAD(q->ne[1], GGML_KQ_MASK_PAD) && \"the Flash-Attention kernel requires the mask to be padded to GGML_KQ_MASK_PAD and at least n_queries big\""
      ;
      line = 0x113d;
      goto LAB_0011e374;
    }
  }
  local_58 = v->ne[0];
  local_50 = lVar1;
  local_48 = lVar4;
  local_40 = lVar2;
  pgVar5 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,&local_58,(ggml_tensor *)0x0,0);
  if (pgVar5 != (ggml_tensor *)0x0) {
    pgVar5->op_params[0] = (int32_t)scale;
    pgVar5->op_params[1] = (int32_t)max_bias;
    pgVar5->op_params[2] = (int32_t)logit_softcap;
    pgVar5->op = GGML_OP_FLASH_ATTN_EXT;
    pgVar5->src[0] = q;
    pgVar5->src[1] = k;
    pgVar5->src[2] = v;
    pgVar5->src[3] = mask;
    return pgVar5;
  }
  file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h";
  pcVar6 = "tensor != NULL";
  line = 0x70;
LAB_0011e374:
  ggml_abort(file,line,"GGML_ASSERT(%s) failed",pcVar6);
}

Assistant:

struct ggml_tensor * ggml_flash_attn_ext(
        struct ggml_context * ctx,
        struct ggml_tensor  * q,
        struct ggml_tensor  * k,
        struct ggml_tensor  * v,
        struct ggml_tensor  * mask,
        float                 scale,
        float                 max_bias,
        float                 logit_softcap) {
    GGML_ASSERT(ggml_can_mul_mat(k, q));
    // TODO: check if vT can be multiplied by (k*qT)

    if (mask) {
        GGML_ASSERT(ggml_is_contiguous(mask));
        GGML_ASSERT(mask->ne[2] == 1);
        GGML_ASSERT(mask->ne[3] == 1);
        GGML_ASSERT(mask->ne[1] >= GGML_PAD(q->ne[1], GGML_KQ_MASK_PAD) &&
                "the Flash-Attention kernel requires the mask to be padded to GGML_KQ_MASK_PAD and at least n_queries big");
        //GGML_ASSERT(ggml_can_repeat_rows(mask, qk));
    }

    if (max_bias > 0.0f) {
        GGML_ASSERT(mask);
    }

    // permute(0, 2, 1, 3)
    int64_t ne[4] = { v->ne[0], q->ne[2], q->ne[1], q->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    float params[] = { scale, max_bias, logit_softcap };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_FLASH_ATTN_EXT;
    result->src[0] = q;
    result->src[1] = k;
    result->src[2] = v;
    result->src[3] = mask;

    return result;
}